

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::SummaryTest_sample_count_Test::~SummaryTest_sample_count_Test
          (SummaryTest_sample_count_Test *this)

{
  SummaryTest_sample_count_Test *this_local;
  
  ~SummaryTest_sample_count_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(SummaryTest, sample_count) {
  Summary summary{Summary::Quantiles{{0.5, 0.05}}};
  summary.Observe(0);
  summary.Observe(200);
  auto metric = summary.Collect();
  auto s = metric.summary;
  EXPECT_EQ(s.sample_count, 2U);
}